

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * __thiscall
tinygraph::any_to_str_abi_cxx11_(string *__return_storage_ptr__,tinygraph *this,any *val)

{
  uint uVar1;
  char *pcVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  type_info *ptVar5;
  uint *puVar6;
  long *plVar7;
  float *pfVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong uVar11;
  uint __len;
  allocator<char> local_21;
  
  ptVar5 = std::any::type((any *)this);
  pcVar2 = *(char **)(ptVar5 + 8);
  if ((pcVar2 == _compare) || ((*pcVar2 != '*' && (iVar4 = strcmp(pcVar2,_compare), iVar4 == 0)))) {
    puVar6 = (uint *)std::__any_caster<int>((any *)this);
    if (puVar6 != (uint *)0x0) {
      uVar1 = *puVar6;
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar11 = (ulong)__val;
        uVar3 = 4;
        do {
          __len = uVar3;
          uVar10 = (uint)uVar11;
          if (uVar10 < 100) {
            __len = __len - 2;
            goto LAB_0010a01d;
          }
          if (uVar10 < 1000) {
            __len = __len - 1;
            goto LAB_0010a01d;
          }
          if (uVar10 < 10000) goto LAB_0010a01d;
          uVar11 = uVar11 / 10000;
          uVar3 = __len + 4;
        } while (99999 < uVar10);
        __len = __len + 1;
      }
LAB_0010a01d:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct
                ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
      return __return_storage_ptr__;
    }
  }
  else {
    ptVar5 = std::any::type((any *)this);
    pcVar2 = *(char **)(ptVar5 + 8);
    if ((pcVar2 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
       ((*pcVar2 != '*' &&
        (iVar4 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar4 == 0))
       )) {
      plVar7 = (long *)std::__any_caster<std::__cxx11::string>((any *)this);
      if (plVar7 != (long *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*plVar7,plVar7[1] + *plVar7);
        return __return_storage_ptr__;
      }
    }
    else {
      ptVar5 = std::any::type((any *)this);
      pcVar2 = *(char **)(ptVar5 + 8);
      if ((pcVar2 != _Init) && ((*pcVar2 == '*' || (iVar4 = strcmp(pcVar2,_Init), iVar4 != 0)))) {
        ptVar5 = std::any::type((any *)this);
        pcVar2 = *(char **)(ptVar5 + 8);
        if ((pcVar2 == _vsnprintf) ||
           ((*pcVar2 != '*' && (iVar4 = strcmp(pcVar2,_vsnprintf), iVar4 == 0)))) {
          puVar9 = (undefined8 *)std::__any_caster<char_const*>((any *)this);
          if (puVar9 == (undefined8 *)0x0) goto LAB_0010a059;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,(char *)*puVar9,&local_21);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"<value>","");
        }
        return __return_storage_ptr__;
      }
      pfVar8 = (float *)std::__any_caster<float>((any *)this);
      if (pfVar8 != (float *)0x0) {
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (__return_storage_ptr__,vsnprintf,0x3a,"%f",(double)*pfVar8);
        return __return_storage_ptr__;
      }
    }
  }
LAB_0010a059:
  std::__throw_bad_any_cast();
}

Assistant:

std::string any_to_str(const std::any* val) {
        if (val->type() == typeid(int)) {
            return std::to_string(std::any_cast<int>(*val));
        } else if (val->type() == typeid(std::string)) {
            return std::any_cast<std::string>(*val);
        } else if (val->type() == typeid(float)) {
            return std::to_string(std::any_cast<float>(*val));
        } else if (val->type() == typeid(const char*)) {
            return std::any_cast<const char*>(*val);
        } else {
            return "<value>";
        }
    }